

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClau.c
# Opt level: O3

void Fra_ClauMinimizeClause(Cla_Man_t *p,Vec_Int_t *vBasis,Vec_Int_t *vExtra)

{
  int *piVar1;
  bool bVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  iVar3 = vExtra->nSize;
  if (0 < (long)iVar3) {
    uVar7 = (ulong)(iVar3 - 1);
    lVar5 = uVar7 * 4 + 4;
    lVar6 = (long)iVar3;
    do {
      if (vExtra->nSize < lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                      ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      vBasis->nSize = 0;
      iVar3 = vExtra->nSize;
      if (0 < iVar3) {
        lVar4 = 0;
        do {
          if (lVar6 + -1 != lVar4) {
            Vec_IntPush(vBasis,vExtra->pArray[lVar4]);
            iVar3 = vExtra->nSize;
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar3);
      }
      iVar3 = Fra_ClauCheckClause(p,vBasis,(Vec_Int_t *)0x0);
      if (iVar3 != 0) {
        if (lVar6 < vExtra->nSize) {
          piVar1 = vExtra->pArray;
          lVar4 = 0;
          do {
            *(undefined4 *)((long)piVar1 + lVar4 * 4 + lVar5 + -4) =
                 *(undefined4 *)((long)piVar1 + lVar4 * 4 + lVar5);
            iVar3 = vExtra->nSize + -1;
            lVar4 = lVar4 + 1;
          } while ((int)lVar4 + (int)uVar7 < iVar3);
        }
        else {
          iVar3 = vExtra->nSize + -1;
        }
        vExtra->nSize = iVar3;
      }
      uVar7 = uVar7 - 1;
      lVar5 = lVar5 + -4;
      bVar2 = 1 < lVar6;
      lVar6 = lVar6 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void Fra_ClauMinimizeClause( Cla_Man_t * p, Vec_Int_t * vBasis, Vec_Int_t * vExtra )
{
    int iLit, iLit2, i, k;
    Vec_IntForEachEntryReverse( vExtra, iLit, i )
    {
        // copy literals without the given one
        Vec_IntClear( vBasis );
        Vec_IntForEachEntry( vExtra, iLit2, k )
            if ( k != i )
                Vec_IntPush( vBasis, iLit2 );
        // try whether it is inductive
        if ( !Fra_ClauCheckClause( p, vBasis, NULL ) )
            continue;
        // the clause is inductive
        // remove the literal
        for ( k = i; k < Vec_IntSize(vExtra)-1; k++ )
            Vec_IntWriteEntry( vExtra, k, Vec_IntEntry(vExtra,k+1) );
        Vec_IntShrink( vExtra, Vec_IntSize(vExtra)-1 );
    }
}